

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O0

void verifyTinySVD_4x4<float>(Matrix44<float> *A)

{
  float *pfVar1;
  Matrix44 *in_RDI;
  Matrix44 *pMVar2;
  float extraout_XMM0_Da;
  float fVar3;
  int i_5;
  int i_4;
  int j_2;
  int i_3;
  Matrix44<float> product;
  int j_1;
  int i_2;
  Matrix44<float> S_times_Vt;
  Vec4<float> S;
  Matrix44<float> V;
  Matrix44<float> U;
  bool posDet;
  int i_1;
  float valueEps;
  float eps;
  int j;
  int i;
  float maxEntry;
  float in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  float in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  Matrix44<float> *in_stack_fffffffffffffec0;
  int local_100;
  int local_fc;
  Matrix44<float> *in_stack_ffffffffffffff20;
  Matrix44<float> *in_stack_ffffffffffffff30;
  Vec4<float> local_b8;
  Matrix44<float> local_a8;
  Matrix44<float> local_68;
  byte local_25;
  int local_24;
  float local_20;
  float local_1c;
  float local_18;
  int local_14;
  int local_10;
  float local_c;
  Matrix44 *local_8;
  
  local_c = 0.0;
  local_8 = in_RDI;
  for (local_10 = 0; local_10 < 4; local_10 = local_10 + 1) {
    for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
      pMVar2 = local_8;
      Imath_3_2::Matrix44<float>::operator[]((Matrix44<float> *)local_8,local_10);
      std::abs((int)pMVar2);
      pfVar1 = std::max<float>(&local_c,&local_18);
      local_c = *pfVar1;
    }
  }
  local_1c = std::numeric_limits<float>::epsilon();
  local_20 = local_c * 100.0 * 1.1920929e-07;
  local_24 = 0;
  while( true ) {
    if (1 < local_24) {
      return;
    }
    local_25 = local_24 == 0;
    Imath_3_2::Matrix44<float>::Matrix44(&local_68);
    Imath_3_2::Matrix44<float>::Matrix44(&local_a8);
    Imath_3_2::Vec4<float>::Vec4(&local_b8);
    Imath_3_2::jacobiSVD<float>
              (local_8,(Matrix44 *)&local_68,(Vec4 *)&local_b8,(Matrix44 *)&local_a8,1.1920929e-07,
               (bool)(local_25 & 1));
    Imath_3_2::Matrix44<float>::Matrix44((Matrix44<float> *)&stack0xffffffffffffff08);
    for (local_fc = 0; local_fc < 4; local_fc = local_fc + 1) {
      for (local_100 = 0; local_100 < 4; local_100 = local_100 + 1) {
        pfVar1 = Imath_3_2::Vec4<float>::operator[](&local_b8,local_100);
        in_stack_fffffffffffffea8 = *pfVar1;
        pfVar1 = Imath_3_2::Matrix44<float>::operator[](&local_a8,local_fc);
        in_stack_fffffffffffffeac = in_stack_fffffffffffffea8 * pfVar1[local_100];
        pfVar1 = Imath_3_2::Matrix44<float>::operator[]
                           ((Matrix44<float> *)&stack0xffffffffffffff08,local_fc);
        pfVar1[local_100] = in_stack_fffffffffffffeac;
      }
    }
    Imath_3_2::Matrix44<float>::transpose(in_stack_ffffffffffffff20);
    Imath_3_2::Matrix44<float>::operator*
              ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               (Matrix44<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    for (local_144 = 0; local_144 < 4; local_144 = local_144 + 1) {
      for (local_148 = 0; local_148 < 4; local_148 = local_148 + 1) {
        pfVar1 = Imath_3_2::Matrix44<float>::operator[]
                           ((Matrix44<float> *)&stack0xfffffffffffffec0,local_144);
        in_stack_fffffffffffffea4 = pfVar1[local_148];
        pMVar2 = local_8;
        Imath_3_2::Matrix44<float>::operator[]((Matrix44<float> *)local_8,local_144);
        std::abs((int)pMVar2);
        if (local_20 < extraout_XMM0_Da) {
          __assert_fail("std::abs (product[i][j] - A[i][j]) <= valueEps",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                        ,0x8b,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = float]");
        }
      }
    }
    if ((local_25 & 1) != 0) {
      fVar3 = Imath_3_2::Matrix44<float>::determinant(in_stack_fffffffffffffec0);
      if (fVar3 <= 0.99) {
        __assert_fail("U.determinant () > 0.99",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x90,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = float]");
      }
      fVar3 = Imath_3_2::Matrix44<float>::determinant(in_stack_fffffffffffffec0);
      if (fVar3 <= 0.99) {
        __assert_fail("V.determinant () > 0.99",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x91,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = float]");
      }
    }
    for (local_14c = 0; local_14c < 3; local_14c = local_14c + 1) {
      pfVar1 = Imath_3_2::Vec4<float>::operator[](&local_b8,local_14c);
      in_stack_fffffffffffffea0 = *pfVar1;
      pfVar1 = Imath_3_2::Vec4<float>::operator[](&local_b8,local_14c + 1);
      if (in_stack_fffffffffffffea0 < *pfVar1) {
        __assert_fail("S[i] >= S[i + 1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x96,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = float]");
      }
    }
    for (local_150 = 0; local_150 < 3; local_150 = local_150 + 1) {
      pfVar1 = Imath_3_2::Vec4<float>::operator[](&local_b8,local_150);
      if (*pfVar1 < 0.0) {
        __assert_fail("S[i] >= T (0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x9a,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = float]");
      }
    }
    if (((local_25 & 1) == 0) &&
       (pfVar1 = Imath_3_2::Vec4<float>::operator[](&local_b8,3), *pfVar1 < 0.0)) break;
    verifyOrthonormal<float>(in_stack_ffffffffffffff30);
    verifyOrthonormal<float>(in_stack_ffffffffffffff30);
    local_24 = local_24 + 1;
  }
  __assert_fail("S[3] >= T (0)",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                ,0x9c,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = float]");
}

Assistant:

void
verifyTinySVD_4x4 (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    T maxEntry = 0;
    for (int i = 0; i < 4; ++i)
        for (int j = 0; j < 4; ++j)
            maxEntry = std::max (maxEntry, std::abs (A[i][j]));

    const T eps      = std::numeric_limits<T>::epsilon ();
    const T valueEps = maxEntry * T (100) * eps;

    for (int i = 0; i < 2; ++i)
    {
        const bool posDet = (i == 0);

        IMATH_INTERNAL_NAMESPACE::Matrix44<T> U, V;
        IMATH_INTERNAL_NAMESPACE::Vec4<T>     S;
        IMATH_INTERNAL_NAMESPACE::jacobiSVD (A, U, S, V, eps, posDet);

        IMATH_INTERNAL_NAMESPACE::Matrix44<T> S_times_Vt;
        for (int i = 0; i < 4; ++i)
            for (int j = 0; j < 4; ++j)
                S_times_Vt[i][j] = S[j] * V[i][j];
        S_times_Vt.transpose ();

        // Verify that the product of the matrices is A:
        const IMATH_INTERNAL_NAMESPACE::Matrix44<T> product = U * S_times_Vt;
        for (int i = 0; i < 4; ++i)
            for (int j = 0; j < 4; ++j)
                assert (std::abs (product[i][j] - A[i][j]) <= valueEps);

        // Verify that U and V have positive determinant if requested:
        if (posDet)
        {
            assert (U.determinant () > 0.99);
            assert (V.determinant () > 0.99);
        }

        // Verify that the singular values are sorted:
        for (int i = 0; i < 3; ++i)
            assert (S[i] >= S[i + 1]);

        // Verify that all the SVs except maybe the last one are positive:
        for (int i = 0; i < 3; ++i)
            assert (S[i] >= T (0));

        if (!posDet) assert (S[3] >= T (0));

        verifyOrthonormal (U);
        verifyOrthonormal (V);
    }
}